

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

QString * __thiscall QFileSystemModelPrivate::size(QFileSystemModelPrivate *this,QModelIndex *index)

{
  QLatin1StringView latin1;
  bool bVar1;
  QFileSystemModelPrivate *in_RSI;
  QFileSystemNode *in_RDI;
  QLatin1StringView QVar2;
  QFileSystemNode *n;
  QFileSystemNode *index_00;
  qint64 in_stack_ffffffffffffffd0;
  QFileSystemModelPrivate *pQVar3;
  QFileSystemNode *pQVar4;
  
  index_00 = in_RDI;
  pQVar3 = in_RSI;
  pQVar4 = in_RDI;
  bVar1 = QModelIndex::isValid((QModelIndex *)in_RDI);
  if (bVar1) {
    node(in_RSI,(QModelIndex *)index_00);
    bVar1 = QFileSystemNode::isDir(in_RDI);
    if (bVar1) {
      QVar2 = Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)index_00);
      latin1.m_data = (char *)pQVar4;
      latin1.m_size = (qsizetype)pQVar3;
      QString::QString((QString *)QVar2.m_size,latin1);
    }
    else {
      QFileSystemNode::size(in_RDI);
      size(in_stack_ffffffffffffffd0);
    }
  }
  else {
    QString::QString((QString *)0xaa5774);
  }
  return &index_00->fileName;
}

Assistant:

QString QFileSystemModelPrivate::size(const QModelIndex &index) const
{
    if (!index.isValid())
        return QString();
    const QFileSystemNode *n = node(index);
    if (n->isDir()) {
#ifdef Q_OS_MAC
        return "--"_L1;
#else
        return ""_L1;
#endif
    // Windows   - ""
    // OS X      - "--"
    // Konqueror - "4 KB"
    // Nautilus  - "9 items" (the number of children)
    }
    return size(n->size());
}